

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O3

shared_ptr<duckdb::ExtraTypeInfo,_true> __thiscall
duckdb::ArrayTypeInfo::Deserialize(ArrayTypeInfo *this,Deserializer *deserializer)

{
  uint uVar1;
  uint32_t size_p;
  _func_int **pp_Var2;
  ArrayTypeInfo *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar3;
  LogicalType child_type;
  LogicalType LStack_68;
  LogicalType local_50;
  ArrayTypeInfo *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"child_type");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  LogicalType::Deserialize(&LStack_68,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"size");
  pp_Var2 = deserializer->_vptr_Deserializer;
  size_p = 0;
  if ((char)uVar1 != '\0') {
    size_p = (*pp_Var2[0x13])(deserializer);
    pp_Var2 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var2[5])(deserializer,(ulong)(uVar1 & 0xff));
  this_00 = (ArrayTypeInfo *)operator_new(0x58);
  LogicalType::LogicalType(&local_50,&LStack_68);
  ArrayTypeInfo(this_00,&local_50,size_p);
  local_38 = this_00;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<duckdb::ArrayTypeInfo*>
            (a_Stack_30,this_00);
  LogicalType::~LogicalType(&local_50);
  (this->super_ExtraTypeInfo)._vptr_ExtraTypeInfo = (_func_int **)local_38;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_ExtraTypeInfo).type =
       a_Stack_30[0]._M_pi;
  LogicalType::~LogicalType(&LStack_68);
  sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ExtraTypeInfo;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> ArrayTypeInfo::Deserialize(Deserializer &deserializer) {
	auto child_type = deserializer.ReadProperty<LogicalType>(200, "child_type");
	auto size = deserializer.ReadPropertyWithDefault<uint32_t>(201, "size");
	auto result = duckdb::shared_ptr<ArrayTypeInfo>(new ArrayTypeInfo(std::move(child_type), size));
	return std::move(result);
}